

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

HMODULE PAL_RegisterLibraryDirect(void *dl_handle,LPCWSTR lpLibFileName)

{
  bool bVar1;
  size_t sVar2;
  char *multibyteLibraryPath;
  HMODULE pVVar3;
  long in_FS_OFFSET;
  int local_74;
  undefined1 local_70 [4];
  INT name_length;
  PathCharString pathstr;
  
  pathstr.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  pathstr._32_8_ = local_70;
  pathstr.m_size = 0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001f6417;
  bVar1 = LOADVerifyLibraryPath<char16_t>(lpLibFileName);
  if (bVar1) {
    sVar2 = PAL_wcslen(lpLibFileName);
    multibyteLibraryPath =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)local_70,(long)MaxWCharToAcpLength * (sVar2 + 1));
    if (multibyteLibraryPath == (char *)0x0) goto LAB_001f63e6;
    bVar1 = LOADConvertLibraryPathWideStringToMultibyteString
                      (lpLibFileName,multibyteLibraryPath,&local_74);
    if (!bVar1) goto LAB_001f63e6;
    FILEDosToUnixPathA(multibyteLibraryPath);
    if ((ulong)(long)local_74 < pathstr.m_size) {
      pathstr.m_size = (long)local_74;
    }
    *(undefined1 *)(pathstr._32_8_ + pathstr.m_size) = 0;
    LockModuleList();
    pVVar3 = LOADRegisterLibraryDirect(dl_handle,multibyteLibraryPath,1);
    UnlockModuleList();
  }
  else {
LAB_001f63e6:
    pVVar3 = (HMODULE)0x0;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_70);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == pathstr.m_count) {
      return pVVar3;
    }
    __stack_chk_fail();
  }
LAB_001f6417:
  abort();
}

Assistant:

HMODULE
PALAPI
PAL_RegisterLibraryDirect(
    IN void *dl_handle,
    IN LPCWSTR lpLibFileName)
{
    PathCharString pathstr;
    CHAR * lpstr = nullptr;
    INT name_length;
    HMODULE hModule = nullptr;

    PERF_ENTRY(RegisterLibraryDirect);
    ENTRY("RegisterLibraryDirect (lpLibFileName=%p (%S)) \n",
        lpLibFileName ? lpLibFileName : W16_NULLSTRING,
        lpLibFileName ? lpLibFileName : W16_NULLSTRING);

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto done;
    }

    lpstr = pathstr.OpenStringBuffer((PAL_wcslen(lpLibFileName)+1) * MaxWCharToAcpLength);
    if (nullptr == lpstr)
    {
        goto done;
    }
    if (!LOADConvertLibraryPathWideStringToMultibyteString(lpLibFileName, lpstr, &name_length))
    {
        goto done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    FILEDosToUnixPathA(lpstr);
    pathstr.CloseBuffer(name_length);

    /* let LOADRegisterLibraryDirect call SetLastError in case of failure */
    LockModuleList();
    hModule = LOADRegisterLibraryDirect((void *)dl_handle, lpstr, true /* fDynamic */);
    UnlockModuleList();

done:
    LOGEXIT("RegisterLibraryDirect returns HMODULE %p\n", hModule);
    PERF_EXIT(RegisterLibraryDirect);
    return hModule;
}